

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cc
# Opt level: O3

void __thiscall iqxmlrpc::Request::Request(Request *this,string *name_,Param_list *params_)

{
  pointer pcVar1;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name_->_M_string_length);
  std::vector<iqxmlrpc::Value,_std::allocator<iqxmlrpc::Value>_>::vector(&this->params,params_);
  return;
}

Assistant:

Request::Request( const std::string& name_, const Param_list& params_ ):
  name(name_),
  params(params_)
{
}